

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keytap2.cpp
# Opt level: O3

bool clusterDBSCAN(TSimilarityMap *sim,TValueCC epsCC,int minPts,TKeyPressCollection *keyPresses)

{
  pointer psVar1;
  undefined1 auVar2 [16];
  int iVar3;
  TClusterId *pTVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  vector<int,_std::allocator<int>_> nbi;
  vector<int,_std::allocator<int>_> nbq;
  int local_9c;
  TKeyPressCollection *local_98;
  int local_8c;
  void *local_88;
  iterator iStack_80;
  int *local_78;
  void *local_68;
  iterator iStack_60;
  int *local_58;
  TClusterId *local_48;
  TValueCC local_40;
  ulong local_38;
  
  auVar2 = _DAT_00115030;
  psVar1 = (keyPresses->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
           ).super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar8 = (int)((long)(keyPresses->
                      super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
                      super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4) * -0x55555555;
  if (0 < (int)uVar8) {
    uVar5 = (ulong)(uVar8 + 3 & 0xfffffffc);
    lVar6 = (ulong)(uVar8 & 0x7fffffff) - 1;
    auVar9._8_4_ = (int)lVar6;
    auVar9._0_8_ = lVar6;
    auVar9._12_4_ = (int)((ulong)lVar6 >> 0x20);
    pTVar4 = &psVar1[3].cid;
    auVar9 = auVar9 ^ _DAT_00115030;
    auVar10 = _DAT_00115010;
    auVar11 = _DAT_00115020;
    do {
      auVar12 = auVar11 ^ auVar2;
      iVar7 = auVar9._4_4_;
      if ((bool)(~(auVar12._4_4_ == iVar7 && auVar9._0_4_ < auVar12._0_4_ || iVar7 < auVar12._4_4_)
                & 1)) {
        pTVar4[-0x24] = 0xffffffff;
      }
      if ((auVar12._12_4_ != auVar9._12_4_ || auVar12._8_4_ <= auVar9._8_4_) &&
          auVar12._12_4_ <= auVar9._12_4_) {
        pTVar4[-0x18] = 0xffffffff;
      }
      auVar12 = auVar10 ^ auVar2;
      iVar3 = auVar12._4_4_;
      if (iVar3 <= iVar7 && (iVar3 != iVar7 || auVar12._0_4_ <= auVar9._0_4_)) {
        pTVar4[-0xc] = 0xffffffff;
        *pTVar4 = -1;
      }
      lVar6 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 4;
      auVar11._8_8_ = lVar6 + 4;
      lVar6 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 4;
      auVar10._8_8_ = lVar6 + 4;
      pTVar4 = pTVar4 + 0x30;
      uVar5 = uVar5 - 4;
    } while (uVar5 != 0);
    if (0 < (int)uVar8) {
      local_38 = (ulong)(uVar8 & 0x7fffffff);
      uVar5 = 0;
      iVar7 = 0;
      local_98 = keyPresses;
      local_8c = minPts;
      local_40 = epsCC;
      do {
        psVar1 = (keyPresses->
                 super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
                 super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (psVar1[uVar5].cid == -1) {
          local_48 = &psVar1[uVar5].cid;
          local_88 = (void *)0x0;
          iStack_80._M_current = (int *)0x0;
          local_78 = (int *)0x0;
          local_68 = (void *)((ulong)local_68 & 0xffffffff00000000);
          iVar3 = 0;
          do {
            if (local_40 <
                *(double *)
                 (*(long *)&(sim->
                            super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start[uVar5].
                            super__Vector_base<stMatch,_std::allocator<stMatch>_>._M_impl.
                            super__Vector_impl_data + (long)iVar3 * 0x10)) {
              if (iStack_80._M_current == local_78) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)&local_88,iStack_80,(int *)&local_68);
              }
              else {
                *iStack_80._M_current = iVar3;
                iStack_80._M_current = iStack_80._M_current + 1;
              }
            }
            iVar3 = (int)local_68 + 1;
            local_68 = (void *)CONCAT44(local_68._4_4_,iVar3);
          } while (iVar3 < (int)uVar8);
          iVar3 = (int)((ulong)((long)iStack_80._M_current - (long)local_88) >> 2);
          keyPresses = local_98;
          if (iVar3 < local_8c) {
            *local_48 = 0;
          }
          else {
            iVar7 = iVar7 + 1;
            *local_48 = iVar7;
            if (0 < iVar3) {
              lVar6 = 0;
              do {
                pTVar4 = &(keyPresses->
                          super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                          ).
                          super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                          ._M_impl.super__Vector_impl_data._M_start
                          [*(int *)((long)local_88 + lVar6 * 4)].cid;
                iVar3 = *pTVar4;
                if (*pTVar4 == 0) {
                  *pTVar4 = iVar7;
                  iVar3 = iVar7;
                }
                if (iVar3 == -1) {
                  *pTVar4 = iVar7;
                  local_68 = (void *)0x0;
                  iStack_60._M_current = (int *)0x0;
                  local_58 = (int *)0x0;
                  local_9c = 0;
                  do {
                    if (local_40 <
                        *(double *)
                         (*(long *)&(sim->
                                    super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start
                                    [*(int *)((long)local_88 + lVar6 * 4)].
                                    super__Vector_base<stMatch,_std::allocator<stMatch>_>._M_impl.
                                    super__Vector_impl_data + (long)local_9c * 0x10)) {
                      if (iStack_60._M_current == local_58) {
                        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                  ((vector<int,std::allocator<int>> *)&local_68,iStack_60,&local_9c)
                        ;
                      }
                      else {
                        *iStack_60._M_current = local_9c;
                        iStack_60._M_current = iStack_60._M_current + 1;
                      }
                    }
                    local_9c = local_9c + 1;
                  } while (local_9c < (int)uVar8);
                  if (local_8c <= (int)((ulong)((long)iStack_60._M_current - (long)local_68) >> 2))
                  {
                    std::vector<int,std::allocator<int>>::
                    _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                              ((vector<int,std::allocator<int>> *)&local_88,iStack_80._M_current);
                  }
                  keyPresses = local_98;
                  if (local_68 != (void *)0x0) {
                    operator_delete(local_68,(long)local_58 - (long)local_68);
                    keyPresses = local_98;
                  }
                }
                lVar6 = lVar6 + 1;
              } while (lVar6 < (int)((ulong)((long)iStack_80._M_current - (long)local_88) >> 2));
            }
          }
          if (local_88 != (void *)0x0) {
            operator_delete(local_88,(long)local_78 - (long)local_88);
            keyPresses = local_98;
          }
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != local_38);
    }
  }
  return true;
}

Assistant:

bool clusterDBSCAN(const TSimilarityMap & sim, TValueCC epsCC, int minPts, TKeyPressCollection & keyPresses) {
    int n = keyPresses.size();
    for (int i = 0; i < n; ++i) {
        auto & cid = keyPresses[i].cid;

        cid = -1;
    }

    int curId = 0;

    for (int i = 0; i < n; ++i) {
        auto & cid = keyPresses[i].cid;

        if (cid != -1) continue;
        std::vector<int> nbi;
        for (int j = 0; j < n; ++j) {
            auto & cc = sim[i][j].cc;

            if (cc > epsCC) nbi.push_back(j);
        }

        if ((int) nbi.size() < minPts) {
            cid = 0;
            continue;
        }

        cid = ++curId;
        for (int q = 0; q < (int) nbi.size(); ++q) {
            auto & qcid = keyPresses[nbi[q]].cid;

            if (qcid == 0) qcid = curId;
            if (qcid != -1) continue;
            qcid = curId;

            std::vector<int> nbq;
            for (int j = 0; j < n; ++j) {
                auto & cc = sim[nbi[q]][j].cc;

                if (cc > epsCC) nbq.push_back(j);
            }

            if ((int) nbq.size() >= minPts) {
                nbi.insert(nbi.end(), nbq.begin(), nbq.end());
            }
        }
    }

    return true;
}